

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cpp
# Opt level: O2

vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *
lookup(vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *__return_storage_ptr__,
      string_view symbol,Search_type st)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  pointer puVar1;
  bool bVar2;
  uintmax_t uVar3;
  size_type sVar4;
  Symbol_lib_entry *this;
  initializer_list<Symbol_lib_entry> __l;
  basic_string_view<char,_std::char_traits<char>_> __x;
  allocator_type local_2a1;
  File_content_iterator pos;
  string_view symbol_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Symbol_lib_entry local_270;
  Symbol_lib_entry value;
  
  symbol_local._M_str = symbol._M_str;
  symbol_local._M_len = symbol._M_len;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&value,(string *)&data_base_index_filepath_abi_cxx11_);
  uVar3 = boost::filesystem::file_size((path *)&value);
  std::__cxx11::string::~string((string *)&value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&indexes,uVar3 >> 2 & 0x3fffffff)
  ;
  std::ifstream::ifstream(&value,(string *)&data_base_index_filepath_abi_cxx11_,_S_in|_S_bin);
  std::istream::read((char *)&value,
                     (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  if ((*(byte *)((long)&value.lib_pos.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                *(long *)(value.entry._M_dataplus._M_p + -0x18)) & 5) != 0) {
    __assert_fail("index_file",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/lookup.cpp"
                  ,0x7f,"std::vector<Symbol_lib_entry> lookup(string_view, Search_type)");
  }
  std::ifstream::~ifstream(&value);
  std::ifstream::open((string *)File_content_iterator::file,0x1347c0);
  puVar1 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this = (Symbol_lib_entry *)
         indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  pos = std::
        __lower_bound<File_content_iterator,std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_less_val>
                  (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&symbol_local);
  if (pos.file_position == puVar1) {
    (__return_storage_ptr__->super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    File_content_iterator::get_element(&value,&pos);
    if (st == exact) {
      __x._M_len = (long)(value.lib_pos.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first - 1;
      __y._M_str = symbol_local._M_str;
      __y._M_len = symbol_local._M_len;
      __x._M_str = value.entry._M_dataplus._M_p;
      bVar2 = std::experimental::fundamentals_v1::operator==(__x,__y);
      if (bVar2) {
        Symbol_lib_entry::Symbol_lib_entry(&local_270,&value);
        __l._M_len = 1;
        __l._M_array = &local_270;
        std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::vector
                  (__return_storage_ptr__,__l,&local_2a1);
        Symbol_lib_entry::~Symbol_lib_entry(&local_270);
      }
      else {
        (__return_storage_ptr__->
        super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
    else {
      (__return_storage_ptr__->
      super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      while( true ) {
        local_270.entry._M_dataplus._M_p =
             (pointer)((long)(value.lib_pos.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first + -1);
        local_270.entry._M_string_length = (size_type)value.entry._M_dataplus._M_p;
        sVar4 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
                ::find((basic_string_view<char,_std::char_traits<char>_> *)&local_270,
                       symbol_local._M_str,0,symbol_local._M_len);
        if (sVar4 != 0) break;
        std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::
        emplace_back<Symbol_lib_entry>(__return_storage_ptr__,&value);
        pos.file_position = pos.file_position + 1;
        if (pos.file_position == puVar1) break;
        File_content_iterator::get_element(&local_270,&pos);
        Symbol_lib_entry::operator=(&value,&local_270);
        Symbol_lib_entry::~Symbol_lib_entry(&local_270);
      }
    }
    this = &value;
    Symbol_lib_entry::~Symbol_lib_entry(this);
  }
  RAII<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/lookup.cpp:130:2)>
  ::~RAII((RAII<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Toeger[P]LibFinder_lookup_cpp:130:2)>
           *)this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Symbol_lib_entry> lookup(string_view symbol, Search_type st) {
	std::vector<File_index_t> indexes;
	{
		File_index_t index_size = boost::filesystem::file_size(data_base_index_filepath);
		indexes.resize(index_size / sizeof(File_index_t));
		std::ifstream index_file(data_base_index_filepath, std::ios_base::in | std::ios::binary);
		index_file.read(any_cast<char *>(indexes.data()), index_size);
		assert(index_file);
	}
	File_content_iterator::file.open(data_base_filepath, std::ios_base::in | std::ios::binary);
	ON_SCOPE_EXIT(File_content_iterator::file.close(););

	//TODO: replace lower_bound with binary_interpolation_search
	auto index_begin = indexes.data();
	auto index_end = indexes.data() + indexes.size();
	auto pos = std::lower_bound(File_content_iterator{index_begin}, File_content_iterator{index_end}, symbol);
	if (pos.file_position == index_end) {
		return {};
	};
	auto value = pos.get_element();
	if (st == Search_type::exact) {
		if (value.get_symbol() == symbol) {
			return {std::move(value)};
		};
		return {};
	}
	std::vector<Symbol_lib_entry> retval;
	while (value.get_symbol().find(symbol) == 0) {
		retval.push_back(std::move(value));
		++pos;
		if (pos.file_position == index_end) {
			return retval;
		}
		value = pos.get_element();
	}
	return retval;
}